

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PigLatinTranslator.cpp
# Opt level: O1

bool is_all_upper_case(string *str)

{
  bool bVar1;
  size_type sVar2;
  
  if (str->_M_string_length != 0) {
    bVar1 = true;
    sVar2 = 0;
    do {
      bVar1 = (bool)(bVar1 & (byte)((str->_M_dataplus)._M_p[sVar2] + 0xbfU) < 0x1a);
      sVar2 = sVar2 + 1;
    } while (str->_M_string_length != sVar2);
    return bVar1;
  }
  return true;
}

Assistant:

bool is_all_upper_case(std::string str) {
  bool isTrue = true;
  for(std::string::iterator letter = str.begin(); letter != str.end(); letter++) {
    isTrue &= is_upper_case(*letter);
  }
  return isTrue;
}